

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

void Wln_RetPrintObj(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  
  iVar1 = Vec_IntEntry(&p->pNtk->vTypes,iObj);
  pcVar5 = Abc_OperName(iVar1);
  uVar2 = Vec_IntEntry(&p->pNtk->vNameIds,iObj);
  uVar3 = Vec_IntEntry(&p->pNtk->vInstIds,iObj);
  lVar7 = (long)iObj;
  printf("Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ",lVar7,pcVar5,
         (ulong)uVar2,(ulong)uVar3,(ulong)(uint)p->pNtk->vFanins[lVar7].nSize);
  lVar8 = 0;
  do {
    if (p->pNtk->vFanins[lVar7].nSize <= lVar8) {
      putchar(10);
      return;
    }
    piVar6 = Wln_RetFanins(p,iObj);
    uVar2 = piVar6[lVar8 * 2];
    piVar6 = Wln_RetFanins(p,iObj);
    if ((long)(int)uVar2 != 0) {
      if (p->pNtk->vFanins[(int)uVar2].nSize == 0) {
        iVar1 = Wln_ObjIsCi(p->pNtk,uVar2);
        if (iVar1 == 0) goto LAB_0031e591;
      }
      printf("%5d ",(ulong)uVar2);
      uVar2 = piVar6[lVar8 * 2 + 1];
      if (uVar2 != 0) {
        uVar3 = Vec_IntEntry(&p->vEdgeLinks,uVar2);
        uVar4 = Vec_IntEntry(&p->vEdgeLinks,piVar6[lVar8 * 2 + 1] + 1);
        printf("(%d : %d %d) ",(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
      }
    }
LAB_0031e591:
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

void Wln_RetPrintObj( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, Type = Wln_ObjType(p->pNtk, iObj), * pLink;
    printf( "Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ", 
        iObj, Abc_OperName(Type), Wln_ObjNameId(p->pNtk, iObj), Wln_ObjInstId(p->pNtk, iObj), Wln_ObjFaninNum(p->pNtk, iObj) );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        printf( "%5d ", iFanin );
        if ( !pLink[0] )
            continue;
        printf( "(%d : %d %d) ", pLink[0], 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]), 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]+1) );
    }
    printf( "\n" );
}